

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<256,_256>::Mark(ObjectBlockPool<256,_256> *this,uint number)

{
  MyLargeBlock *pMVar1;
  int iVar2;
  ulong uVar3;
  MyLargeBlock *pMVar4;
  Block *pBVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (number < 2) {
    pMVar1 = this->activePages;
    if (pMVar1 != (MyLargeBlock *)0x0) {
      uVar3 = (ulong)this->lastNum;
      pMVar4 = pMVar1;
      do {
        if ((pMVar1 != pMVar4) || (iVar2 = (int)uVar3, uVar3 = 0, iVar2 != 0)) {
          pBVar5 = pMVar1->page;
          uVar6 = 0;
          do {
            pBVar5->marker = pBVar5->marker & 0xfffffffffffffffe | (ulong)number;
            uVar6 = uVar6 + 1;
            pMVar4 = this->activePages;
            uVar3 = (ulong)this->lastNum;
            uVar7 = 0x100;
            if (pMVar1 == pMVar4) {
              uVar7 = uVar3;
            }
            pBVar5 = pBVar5 + 1;
          } while (uVar6 < uVar7);
        }
        pMVar1 = pMVar1->next;
      } while (pMVar1 != (LargeBlock<256,_256> *)0x0);
    }
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0xe6,
                "void ObjectBlockPool<256, 256>::Mark(unsigned int) [elemSize = 256, countInBlock = 256]"
               );
}

Assistant:

void Mark(unsigned int number)
	{
		assert(number <= 1);
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				curr->page[i].marker = (curr->page[i].marker & ~NULLC::OBJECT_VISIBLE) | number;
			}
			curr = curr->next;
		}
	}